

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ssize __thiscall Socket::sendTo(Socket *this,byte *data,usize size,uint32 ip,uint16 port)

{
  int *piVar1;
  ssize r;
  sockaddr_in sin;
  uint16 port_local;
  uint32 ip_local;
  usize size_local;
  byte *data_local;
  Socket *this_local;
  
  sin.sin_zero._2_2_ = port;
  sin.sin_zero._4_4_ = ip;
  memset(&r,0,0x10);
  r._0_2_ = 2;
  r._2_2_ = htons(sin.sin_zero._2_2_);
  r._4_4_ = htonl(sin.sin_zero._4_4_);
  this_local = (Socket *)sendto(this->s,data,(long)(int)size,0,(sockaddr *)&r,0x10);
  if (this_local == (Socket *)0xffffffffffffffff) {
    piVar1 = __errno_location();
    if ((*piVar1 == 0xb) || (piVar1 = __errno_location(), *piVar1 == 0xb)) {
      piVar1 = __errno_location();
      *piVar1 = 0;
    }
    this_local = (Socket *)0xffffffffffffffff;
  }
  return (ssize)this_local;
}

Assistant:

ssize Socket::sendTo(const byte* data, usize size, uint32 ip, uint16 port)
{
  struct sockaddr_in sin;
  memset(&sin, 0, sizeof(sin));
  sin.sin_family = AF_INET;
  sin.sin_port = htons(port);
  sin.sin_addr.s_addr = htonl(ip);

  ssize r = ::sendto(s, (const char*)data, (int)size, 0, (sockaddr*)&sin, sizeof(sin));
  if(r == SOCKET_ERROR)
  {
    if(ERRNO == EWOULDBLOCK 
#ifndef _WIN32
      || ERRNO == EAGAIN
#endif
      )
    {
      SET_ERRNO(0);
    }
    return -1;
  }
  return r;
}